

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:666:55)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:666:55)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  global_object *this_00;
  object *poVar6;
  uint *puVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  undefined8 extraout_RDX_02;
  long lVar9;
  pointer pvVar10;
  value *pvVar11;
  gc_heap *this_01;
  uint32_t k;
  mjs *this_02;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  object_ptr o;
  wstring is;
  value callback;
  value kval;
  value this_arg;
  value res;
  allocator_type local_1e9;
  gc_heap_ptr_untyped local_1e8;
  undefined1 local_1d8 [32];
  slot *local_1b8;
  gc_heap_ptr_untyped local_1b0;
  gc_heap_ptr_untyped local_1a0;
  value local_190;
  undefined4 local_168;
  double local_160;
  slot local_140;
  gc_heap_ptr_untyped local_138 [2];
  anon_class_8_1_54a39801 local_118;
  value *local_110;
  gc_heap *local_108;
  gc_heap_ptr_untyped *local_100;
  gc_heap_ptr_untyped local_f8;
  value local_e8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_c0;
  value local_a8;
  value local_80;
  value local_58;
  
  local_1b0.heap_ = (gc_heap *)0x0;
  local_1b0.pos_ = 0;
  local_1a0.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_1a0.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  local_110 = __return_storage_ptr__;
  if (local_1a0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_1a0.heap_,&local_1a0);
  }
  local_f8.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_f8.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  local_100 = &local_1b0;
  if (local_f8.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_f8.heap_,&local_f8);
  }
  local_118.a = (object_ptr *)&local_1b0;
  plVar4 = (long *)gc_heap_ptr_untyped::get(&local_1a0);
  (**(code **)(*plVar4 + 0x88))(&local_1e8,plVar4,this_);
  puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1e8);
  local_e8.type_ = reference;
  local_e8._4_4_ = 0;
  local_e8.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x18f844;
  (**(code **)*puVar5)(&local_190,puVar5);
  uVar2 = to_uint32(&local_190);
  value::destroy(&local_190);
  pvVar10 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (pvVar10 ==
      (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    pvVar10 = (pointer)&value::undefined;
  }
  value::value(&local_e8,pvVar10);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&local_1a0);
  plVar4 = (long *)gc_heap_ptr_untyped::get(&local_1a0);
  (**(code **)(*plVar4 + 0x60))(&local_190,plVar4);
  global_object::validate_type(this_00,&local_e8,(object_ptr *)&local_190,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
  pvVar10 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar10 >> 3) * -0x3333333333333333)
      < 2) {
    pvVar11 = (value *)&value::undefined;
  }
  else {
    pvVar11 = pvVar10 + 1;
  }
  value::value(&local_80,pvVar11);
  make_array((gc_heap_ptr<mjs::global_object> *)&local_190,(uint32_t)&local_f8);
  gc_heap_ptr_untyped::operator=(local_100,(gc_heap_ptr_untyped *)&local_190);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_190);
  if (uVar2 < 0x10000) {
    if (uVar2 != 0) {
      this_02 = (mjs *)0x0;
      uVar8 = extraout_RDX;
      do {
        k = (uint32_t)this_02;
        index_string_abi_cxx11_((wstring *)local_1d8,this_02,(uint32_t)uVar8);
        poVar6 = (object *)gc_heap_ptr_untyped::get(&local_1e8);
        local_190._0_8_ = local_1d8._8_8_;
        local_190.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_1d8._0_8_;
        bVar1 = object::has_property(poVar6,(wstring_view *)&local_190);
        uVar8 = extraout_RDX_00;
        if (bVar1) {
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1e8);
          local_190._0_8_ = local_1d8._8_8_;
          local_190.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_1d8._0_8_;
          (**(code **)*puVar5)(&local_a8,puVar5,&local_190);
          value::value(&local_190,&local_a8);
          local_160 = (double)(int)k;
          local_168 = 3;
          local_140.new_position = 5;
          local_138[0].heap_ = local_1e8.heap_;
          local_138[0].pos_ = local_1e8.pos_;
          if (local_1e8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1e8.heap_,local_138);
          }
          __l._M_len = 3;
          __l._M_array = &local_190;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l,&local_1e9);
          call_function(&local_58,&local_e8,&local_80,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar9 = 0x50;
          do {
            value::destroy((value *)((long)&local_190.type_ + lVar9));
            lVar9 = lVar9 + -0x28;
          } while (lVar9 != -0x28);
          anon_unknown_110::array_map::anon_class_8_1_54a39801::operator()(&local_118,k,&local_58);
          value::destroy(&local_58);
          value::destroy(&local_a8);
          uVar8 = extraout_RDX_01;
        }
        if ((gc_heap *)local_1d8._0_8_ != (gc_heap *)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_,local_1d8._16_8_ * 4 + 4);
          uVar8 = extraout_RDX_02;
        }
        this_02 = (mjs *)(ulong)(k + 1);
      } while (k + 1 != uVar2);
    }
  }
  else {
    poVar6 = (object *)gc_heap_ptr_untyped::get(&local_1e8);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1d8,poVar6);
    local_108 = (gc_heap *)local_1d8._8_8_;
    if (local_1d8._0_8_ != local_1d8._8_8_) {
      local_1b8 = &local_140;
      this_01 = (gc_heap *)local_1d8._0_8_;
      do {
        puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
        local_190.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar7 + 1);
        local_190._0_8_ = ZEXT48(*puVar7);
        uVar2 = index_value_from_string((wstring_view *)&local_190);
        if (uVar2 == 0xffffffff) {
          iVar3 = 6;
        }
        else {
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1e8);
          puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_01);
          local_190.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar7 + 1);
          local_190._0_8_ = ZEXT48(*puVar7);
          (**(code **)*puVar5)(&local_a8,puVar5,&local_190);
          value::value(&local_190,&local_a8);
          local_160 = (double)uVar2;
          local_168 = 3;
          local_140.new_position = 5;
          local_138[0].heap_ = local_1e8.heap_;
          local_138[0].pos_ = local_1e8.pos_;
          if (local_1e8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1e8.heap_,local_138);
          }
          __l_00._M_len = 3;
          __l_00._M_array = &local_190;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l_00,&local_1e9);
          call_function(&local_58,&local_e8,&local_80,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar9 = 0x50;
          do {
            value::destroy((value *)((long)&local_190.type_ + lVar9));
            lVar9 = lVar9 + -0x28;
          } while (lVar9 != -0x28);
          anon_unknown_110::array_map::anon_class_8_1_54a39801::operator()
                    (&local_118,uVar2,&local_58);
          value::destroy(&local_58);
          value::destroy(&local_a8);
          iVar3 = 0;
        }
      } while (((iVar3 == 6) || (iVar3 == 0)) &&
              (this_01 = (gc_heap *)&this_01->alloc_context_, this_01 != local_108));
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1d8);
  }
  value::destroy(&local_80);
  value::destroy(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_f8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1a0);
  pvVar11 = local_110;
  local_110->type_ = object;
  (local_110->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       local_1b0.heap_;
  *(uint32_t *)((long)&local_110->field_1 + 8) = local_1b0.pos_;
  if (local_1b0.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_1b0.heap_,(gc_heap_ptr_untyped *)&(local_110->field_1).s_);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1b0);
  return pvVar11;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }